

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O2

int64_t __thiscall
icu_63::CollationIterator::previousCEUnsafe
          (CollationIterator *this,UChar32 c,UVector32 *offsets,UErrorCode *errorCode)

{
  UBool UVar1;
  int iVar2;
  int64_t iVar3;
  int32_t numBackward;
  uint uVar4;
  
  uVar4 = 1;
  do {
    iVar2 = (*(this->super_UObject)._vptr_UObject[7])(this,errorCode);
    if (iVar2 < 0) break;
    uVar4 = uVar4 + 1;
    UVar1 = CollationData::isUnsafeBackward(this->data,iVar2,this->isNumeric);
  } while (UVar1 != '\0');
  this->numCpFwd = uVar4;
  this->cesIndex = 0;
  iVar2 = (*(this->super_UObject)._vptr_UObject[5])(this);
  while (0 < this->numCpFwd) {
    this->numCpFwd = this->numCpFwd + -1;
    nextCE(this,errorCode);
    this->cesIndex = (this->ceBuffer).length;
    UVector32::addElement(offsets,iVar2,errorCode);
    iVar2 = (*(this->super_UObject)._vptr_UObject[5])(this);
    while (offsets->count < (this->ceBuffer).length) {
      UVector32::addElement(offsets,iVar2,errorCode);
    }
  }
  UVector32::addElement(offsets,iVar2,errorCode);
  this->numCpFwd = -1;
  (*(this->super_UObject)._vptr_UObject[0xd])(this,(ulong)uVar4,errorCode);
  this->cesIndex = 0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar2 = (this->ceBuffer).length;
    (this->ceBuffer).length = iVar2 + -1;
    iVar3 = (this->ceBuffer).buffer.ptr[(long)iVar2 + -1];
  }
  else {
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int64_t
CollationIterator::previousCEUnsafe(UChar32 c, UVector32 &offsets, UErrorCode &errorCode) {
    // We just move through the input counting safe and unsafe code points
    // without collecting the unsafe-backward substring into a buffer and
    // switching to it.
    // This is to keep the logic simple. Otherwise we would have to handle
    // prefix matching going before the backward buffer, switching
    // to iteration and back, etc.
    // In the most important case of iterating over a normal string,
    // reading from the string itself is already maximally fast.
    // The only drawback there is that after getting the CEs we always
    // skip backward to the safe character rather than switching out
    // of a backwardBuffer.
    // But this should not be the common case for previousCE(),
    // and correctness and maintainability are more important than
    // complex optimizations.
    // Find the first safe character before c.
    int32_t numBackward = 1;
    while((c = previousCodePoint(errorCode)) >= 0) {
        ++numBackward;
        if(!data->isUnsafeBackward(c, isNumeric)) {
            break;
        }
    }
    // Set the forward iteration limit.
    // Note: This counts code points.
    // We cannot enforce a limit in the middle of a surrogate pair or similar.
    numCpFwd = numBackward;
    // Reset the forward iterator.
    cesIndex = 0;
    U_ASSERT(ceBuffer.length == 0);
    // Go forward and collect the CEs.
    int32_t offset = getOffset();
    while(numCpFwd > 0) {
        // nextCE() normally reads one code point.
        // Contraction matching and digit specials read more and check numCpFwd.
        --numCpFwd;
        // Append one or more CEs to the ceBuffer.
        (void)nextCE(errorCode);
        U_ASSERT(U_FAILURE(errorCode) || ceBuffer.get(ceBuffer.length - 1) != Collation::NO_CE);
        // No need to loop for getting each expansion CE from nextCE().
        cesIndex = ceBuffer.length;
        // However, we need to write an offset for each CE.
        // This is for CollationElementIterator::getOffset() to return
        // intermediate offsets from the unsafe-backwards segment.
        U_ASSERT(offsets.size() < ceBuffer.length);
        offsets.addElement(offset, errorCode);
        // For an expansion, the offset of each non-initial CE is the limit offset,
        // consistent with forward iteration.
        offset = getOffset();
        while(offsets.size() < ceBuffer.length) {
            offsets.addElement(offset, errorCode);
        };
    }
    U_ASSERT(offsets.size() == ceBuffer.length);
    // End offset corresponding to just after the unsafe-backwards segment.
    offsets.addElement(offset, errorCode);
    // Reset the forward iteration limit
    // and move backward to before the segment for which we fetched CEs.
    numCpFwd = -1;
    backwardNumCodePoints(numBackward, errorCode);
    // Use the collected CEs and return the last one.
    cesIndex = 0;  // Avoid cesIndex > ceBuffer.length when that gets decremented.
    if(U_SUCCESS(errorCode)) {
        return ceBuffer.get(--ceBuffer.length);
    } else {
        return Collation::NO_CE_PRIMARY;
    }
}